

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

Am_Constraint_Tag __thiscall Am_Slot::Add_Dependency(Am_Slot *this,Am_Constraint *new_dependency)

{
  Am_Slot_Data *pAVar1;
  CItem *pCVar2;
  int iVar3;
  ulong in_RAX;
  undefined4 extraout_var;
  CItem *pCVar5;
  Am_Object_Context oc;
  undefined8 uStack_28;
  Am_Constraint *pAVar4;
  
  if (new_dependency != (Am_Constraint *)0x0) {
    uStack_28 = in_RAX;
    iVar3 = (*(new_dependency->super_Am_Registered_Type)._vptr_Am_Registered_Type[0xd])
                      (new_dependency,this);
    pAVar4 = (Am_Constraint *)CONCAT44(extraout_var,iVar3);
    if (pAVar4 == (Am_Constraint *)0x0) {
      pCVar5 = (CItem *)0x0;
    }
    else {
      pAVar1 = this->data;
      pCVar5 = (CItem *)Dyn_Memory_Manager::New(&CItem::memory);
      (pCVar5->field_1).prev = (CItem *)0x0;
      pCVar2 = (pAVar1->dependencies).head;
      pCVar5->next = pCVar2;
      pCVar5->value = pAVar4;
      if (pCVar2 != (CItem *)0x0) {
        (pCVar2->field_1).prev = pCVar5;
      }
      (pAVar1->dependencies).head = pCVar5;
      if ((this->data->field_0x38 & 2) == 0) {
        uStack_28 = uStack_28 & 0xffffffffffffff;
        (*(pAVar4->super_Am_Registered_Type)._vptr_Am_Registered_Type[9])
                  (pAVar4,(long)&uStack_28 + 7,this);
      }
    }
    return pCVar5;
  }
  slot_error("** (0L) dependency added to slot.\n",this->data);
}

Assistant:

Am_Constraint_Tag
Am_Slot::Add_Dependency(Am_Constraint *new_dependency) const
{
  if (!new_dependency)
    slot_error("** (0L) dependency added to slot.\n", data);
  new_dependency = new_dependency->Dependency_Added(*this);
  if (!new_dependency)
    // didn't want to be added
    return (Am_Constraint_Tag)nullptr;

  CItem *tag = data->dependencies.Add_Dep(new_dependency);
  if (!(data->flags & BIT_INHERITS)) {
    Am_Object_Context oc(false);
    new_dependency->Slot_Event(&oc, *this);
  }
  return (Am_Constraint_Tag)tag;
}